

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O2

void __thiscall dynet::NamedTimer::show(NamedTimer *this)

{
  long lVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  
  for (p_Var3 = (this->cumtimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar1 = std::cout,
      (_Rb_tree_header *)p_Var3 != &(this->cumtimes)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 4;
    *(undefined8 *)(operator_delete__ + *(long *)(lVar1 + -0x18)) = 0xb;
    poVar2 = std::ostream::_M_insert<double>(*(double *)(p_Var3 + 2));
    poVar2 = std::operator<<(poVar2,'\t');
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void show() { for (auto &item : cumtimes) { std::cout << std::setprecision(4) << std::setw(11) << item.second << '\t' << item.first << std::endl; } }